

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O0

void add_histogram(void *b_,ReduceProxy *srp)

{
  int iVar1;
  BlockID x;
  ReduceProxy *in_RSI;
  ReduceProxy *in_RDI;
  void *unaff_retaddr;
  int i;
  Histogram histogram;
  Link *in_stack_ffffffffffffff88;
  Proxy *in_stack_ffffffffffffffa0;
  undefined4 local_38;
  ReduceProxy *pRVar2;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11150d);
  receive_histogram(unaff_retaddr,in_RDI,(Histogram *)in_RSI);
  local_38 = 0;
  while( true ) {
    diy::ReduceProxy::out_link(in_RSI);
    iVar1 = diy::Link::size((Link *)0x11154e);
    if (iVar1 <= local_38) break;
    pRVar2 = in_RSI;
    in_stack_ffffffffffffffa0 = (Proxy *)diy::ReduceProxy::out_link(in_RSI);
    x = diy::Link::target(in_stack_ffffffffffffff88,0);
    diy::Master::Proxy::enqueue<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              (in_stack_ffffffffffffffa0,(BlockID *)in_RSI,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)x,
               (_func_void_BinaryBuffer_ptr_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                *)in_stack_ffffffffffffff88);
    local_38 = local_38 + 1;
    in_RSI = pRVar2;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void add_histogram(void* b_, const diy::ReduceProxy& srp)
{
    Histogram histogram;
    receive_histogram(b_, srp, histogram);

    for (int i = 0; i < srp.out_link().size(); ++i)
        srp.enqueue(srp.out_link().target(i), histogram);
}